

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O2

double __thiscall
bgui::ImageAdapter<unsigned_char>::getPixel(ImageAdapter<unsigned_char> *this,float x,float y,int c)

{
  pointer pIVar1;
  work_t wVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  float fVar8;
  
  if ((this->mipmap).
      super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->mipmap).
      super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    dVar6 = (double)this->image->img[c][(long)y][(long)x];
  }
  else {
    dVar6 = log(1.0 / (this->super_ImageAdapterBase).scale);
    uVar3 = (int)(dVar6 / 0.6931471805599453) - 1;
    pIVar1 = (this->mipmap).
             super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (int)(((long)(this->mipmap).
                         super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1) / 0x38) - 1;
    if ((int)uVar3 < (int)uVar5) {
      uVar5 = uVar3;
    }
    uVar3 = uVar5 + 1;
    iVar4 = 1 << ((byte)uVar3 & 0x1f);
    if ((int)uVar5 < 0) {
      wVar2 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (this->image,x,y,c);
      dVar6 = (double)wVar2;
      if (uVar5 != 0xffffffff) {
        return dVar6;
      }
    }
    else {
      fVar8 = (float)iVar4;
      wVar2 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (pIVar1 + uVar5,x / fVar8,y / fVar8,c);
      dVar6 = (double)wVar2;
    }
    pIVar1 = (this->mipmap).
             super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((int)uVar3 <
         (int)(((long)(this->mipmap).
                      super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1) / 0x38)) &&
       (dVar7 = (double)iVar4, dVar7 = (1.0 / (this->super_ImageAdapterBase).scale - dVar7) / dVar7,
       1e-06 < dVar7)) {
      fVar8 = (float)(2 << ((byte)uVar3 & 0x1f));
      wVar2 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (pIVar1 + uVar3,x / fVar8,y / fVar8,c);
      dVar6 = (1.0 - dVar7) * dVar6 + (double)wVar2 * dVar7;
    }
  }
  return dVar6;
}

Assistant:

double getPixel(float x, float y, int c) const
    {
      if (mipmap.size() > 0)
      {
        int j=static_cast<int>(log(1/scale)/log(2))-1;
        j=std::min(static_cast<int>(mipmap.size())-1, j);

        int ds=1<<(j+1);
        double ret;

        if (j < 0)
        {
          ret=image->getBilinear(x, y, c);
        }
        else
        {
          ret=mipmap[j].getBilinear(x/ds, y/ds, c);
        }

        if (j+1 >= 0 && j+1 < static_cast<int>(mipmap.size()))
        {
          double f=(1/scale-ds)/ds;

          if (f > 1e-6)
          {
            ret=(1-f)*ret+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), c);
          }
        }

        return ret;
      }

      return image->get(static_cast<long>(x), static_cast<long>(y), c);
    }